

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cc
# Opt level: O2

void brotli::BuildMetaBlockGreedyWithContexts
               (uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,uint8_t prev_byte2,
               ContextType literal_context_mode,size_t num_contexts,uint32_t *static_context_map,
               Command *commands,size_t n_commands,MetaBlockSplit *mb)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  pointer puVar5;
  Command *pCVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  size_t local_1d0;
  ContextBlockSplitter<brotli::Histogram<256>_> lit_blocks;
  BlockSplitter<brotli::Histogram<520>_> dist_blocks;
  BlockSplitter<brotli::Histogram<704>_> cmd_blocks;
  
  sVar9 = 0;
  pCVar6 = commands;
  sVar7 = n_commands;
  while (bVar12 = sVar7 != 0, sVar7 = sVar7 - 1, bVar12) {
    sVar9 = sVar9 + pCVar6->insert_len_;
    pCVar6 = pCVar6 + 1;
  }
  ContextBlockSplitter<brotli::Histogram<256>_>::ContextBlockSplitter
            (&lit_blocks,0x100,num_contexts,0x200,400.0,sVar9,&mb->literal_split,
             &mb->literal_histograms);
  BlockSplitter<brotli::Histogram<704>_>::BlockSplitter
            (&cmd_blocks,0x2c0,0x400,500.0,n_commands,&mb->command_split,&mb->command_histograms);
  BlockSplitter<brotli::Histogram<520>_>::BlockSplitter
            (&dist_blocks,0x40,0x200,100.0,n_commands,&mb->distance_split,&mb->distance_histograms);
  sVar7 = 0;
  local_1d0 = pos;
  do {
    if (sVar7 == n_commands) {
      ContextBlockSplitter<brotli::Histogram<256>_>::FinishBlock(&lit_blocks,true);
      BlockSplitter<brotli::Histogram<704>_>::FinishBlock(&cmd_blocks,true);
      BlockSplitter<brotli::Histogram<520>_>::FinishBlock(&dist_blocks,true);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&mb->literal_context_map,(mb->literal_split).num_types << 6);
      sVar7 = (mb->literal_split).num_types;
      lVar8 = 0;
      for (sVar9 = 0; sVar9 != sVar7; sVar9 = sVar9 + 1) {
        puVar5 = (mb->literal_context_map).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 1) {
          *(uint32_t *)((long)puVar5 + lVar10 * 4 + lVar8) =
               static_context_map[lVar10] + (int)sVar9 * (int)num_contexts;
        }
        lVar8 = lVar8 + 0x100;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&lit_blocks.last_entropy_.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    uVar3 = commands[sVar7].insert_len_;
    uVar4 = commands[sVar7].copy_len_;
    uVar1 = commands[sVar7].cmd_prefix_;
    uVar2 = commands[sVar7].dist_prefix_;
    BlockSplitter<brotli::Histogram<704>_>::AddSymbol(&cmd_blocks,(ulong)uVar1);
    for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
      if (literal_context_mode < 4) {
        (*(code *)(&DAT_001e42f0 + *(int *)(&DAT_001e42f0 + (ulong)literal_context_mode * 4)))();
        return;
      }
      ContextBlockSplitter<brotli::Histogram<256>_>::AddSymbol
                (&lit_blocks,(ulong)ringbuffer[local_1d0 + uVar11 & mask],(ulong)*static_context_map
                );
    }
    if ((ulong)uVar4 != 0) {
      if (0x7f < uVar1) {
        BlockSplitter<brotli::Histogram<520>_>::AddSymbol(&dist_blocks,(ulong)uVar2);
      }
    }
    local_1d0 = local_1d0 + uVar4 + uVar11;
    sVar7 = sVar7 + 1;
  } while( true );
}

Assistant:

void BuildMetaBlockGreedyWithContexts(const uint8_t* ringbuffer,
                                      size_t pos,
                                      size_t mask,
                                      uint8_t prev_byte,
                                      uint8_t prev_byte2,
                                      ContextType literal_context_mode,
                                      size_t num_contexts,
                                      const uint32_t* static_context_map,
                                      const Command *commands,
                                      size_t n_commands,
                                      MetaBlockSplit* mb) {
  size_t num_literals = 0;
  for (size_t i = 0; i < n_commands; ++i) {
    num_literals += commands[i].insert_len_;
  }

  ContextBlockSplitter<HistogramLiteral> lit_blocks(
      256, num_contexts, 512, 400.0, num_literals,
      &mb->literal_split, &mb->literal_histograms);
  BlockSplitter<HistogramCommand> cmd_blocks(
      kNumCommandPrefixes, 1024, 500.0, n_commands,
      &mb->command_split, &mb->command_histograms);
  BlockSplitter<HistogramDistance> dist_blocks(
      64, 512, 100.0, n_commands,
      &mb->distance_split, &mb->distance_histograms);

  for (size_t i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    cmd_blocks.AddSymbol(cmd.cmd_prefix_);
    for (size_t j = cmd.insert_len_; j != 0; --j) {
      size_t context = Context(prev_byte, prev_byte2, literal_context_mode);
      uint8_t literal = ringbuffer[pos & mask];
      lit_blocks.AddSymbol(literal, static_context_map[context]);
      prev_byte2 = prev_byte;
      prev_byte = literal;
      ++pos;
    }
    pos += cmd.copy_len_;
    if (cmd.copy_len_ > 0) {
      prev_byte2 = ringbuffer[(pos - 2) & mask];
      prev_byte = ringbuffer[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        dist_blocks.AddSymbol(cmd.dist_prefix_);
      }
    }
  }

  lit_blocks.FinishBlock(/* is_final = */ true);
  cmd_blocks.FinishBlock(/* is_final = */ true);
  dist_blocks.FinishBlock(/* is_final = */ true);

  mb->literal_context_map.resize(
      mb->literal_split.num_types << kLiteralContextBits);
  for (size_t i = 0; i < mb->literal_split.num_types; ++i) {
    for (size_t j = 0; j < (1u << kLiteralContextBits); ++j) {
      mb->literal_context_map[(i << kLiteralContextBits) + j] =
          static_cast<uint32_t>(i * num_contexts) + static_context_map[j];
    }
  }
}